

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::key_question(Forth *this)

{
  long lVar1;
  uint x;
  long *plVar2;
  
  requireDStackAvailable(this,1,"KEY?");
  if (this->readFromSource == FromStdCin) {
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x15a598);
    std::istream::sync();
    std::ios_base::sync_with_stdio(true);
    (**(code **)(**(long **)(*(long *)(std::cin + -0x18) + 0x15a680) + 0x30))();
    plVar2 = *(long **)(*(long *)(std::cin + -0x18) + 0x15a680);
    lVar1 = plVar2[3] - plVar2[2];
    if (lVar1 == 0) {
LAB_001181eb:
      lVar1 = (**(code **)(*plVar2 + 0x38))();
    }
  }
  else {
    x = 0;
    if (this->readFromSource != FromString) goto LAB_001181fd;
    std::ios::clear((int)this + 800 + (int)*(undefined8 *)(*(long *)&this->std_cin + -0x18));
    lVar1 = *(long *)&this->field_0x350 - *(long *)&this->field_0x348;
    if (lVar1 == 0) {
      plVar2 = (long *)&this->field_0x338;
      goto LAB_001181eb;
    }
  }
  x = (&this->False)[0 < lVar1];
LAB_001181fd:
  ForthStack<unsigned_int>::push(&this->dStack,x);
  return;
}

Assistant:

void key_question() {
			REQUIRE_DSTACK_AVAILABLE(1, "KEY?");
			Cell flag{} ;
			switch (readFromSource) {
				case FromString:
					std_cin.clear();
					flag = std_cin.rdbuf()->in_avail() > 0 ? True : False;
					break;
				case FromStdCin:
					std::cin.clear(); // clear previous error codes
					std::cin.sync();
					std::cin.sync_with_stdio(true);
					std::cin.rdbuf()->pubsync();
					flag = std::cin.rdbuf()->in_avail() > 0 ? True : False;
					break;
				default:
					break;
			}
			push(flag);
		}